

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O0

Result_Type *
chaiscript::detail::
Cast_Helper_Inner<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::cast(Boxed_Value *ob,Type_Conversions_State *param_2)

{
  bool bVar1;
  string *psVar2;
  undefined8 uVar3;
  Result_Type *in_RDI;
  void *p;
  Result_Type *ti;
  bad_any_cast *in_stack_ffffffffffffffe0;
  
  ti = in_RDI;
  Boxed_Value::get_type_info((Boxed_Value *)0x221c3a);
  bVar1 = Type_Info::bare_equal_type_info((Type_Info *)in_stack_ffffffffffffffe0,(type_info *)ti);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x28);
    exception::bad_any_cast::bad_any_cast(in_stack_ffffffffffffffe0);
    __cxa_throw(uVar3,&exception::bad_any_cast::typeinfo,exception::bad_any_cast::~bad_any_cast);
  }
  Boxed_Value::get_const_ptr((Boxed_Value *)0x221c59);
  psVar2 = (string *)throw_if_null<void_const>(in_stack_ffffffffffffffe0);
  std::__cxx11::string::string((string *)in_RDI,psVar2);
  return ti;
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (ob.get_type_info().bare_equal_type_info(typeid(Result)))
          {
            auto p = throw_if_null(ob.get_const_ptr());
            return *static_cast<const Result *>(p);
          } else {
            throw chaiscript::detail::exception::bad_any_cast();
          }
        }